

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

vector * __thiscall lsh::table::query(vector *__return_storage_ptr__,table *this,vector *v)

{
  long *plVar1;
  uint *puVar2;
  vector *pvVar3;
  table *ptVar4;
  uint uVar5;
  ulong uVar6;
  long *plVar7;
  mapped_type *pmVar8;
  mapped_type *v_00;
  invalid_argument *this_00;
  ulong uVar9;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  long *plVar10;
  uint *puVar11;
  mapped_type *pmVar12;
  uint uVar13;
  uint u;
  vector k;
  uint local_8c;
  undefined1 local_88 [8];
  pointer puStack_80;
  _Bit_type *local_78;
  pointer puStack_70;
  _Bit_pointer local_68;
  vector *local_58;
  vector *local_50;
  ulong local_48;
  table *local_40;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  uVar13 = this->dimensions_;
  local_50 = v;
  uVar5 = vector::size(v);
  if (uVar13 != uVar5) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar6 = ((long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_58 = __return_storage_ptr__;
  if ((int)uVar6 == 0) {
    pmVar12 = (mapped_type *)0x0;
  }
  else {
    local_38 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->vectors_;
    local_48 = uVar6 & 0xffffffff;
    uVar13 = 0xffffffff;
    uVar6 = 0;
    pmVar12 = (mapped_type *)0x0;
    local_40 = this;
    do {
      ptVar4 = local_40;
      vector::operator&((vector *)local_88,
                        (local_40->masks_).
                        super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar6,local_50);
      this_01 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)((ptVar4->partitions_).
                    super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6);
      uVar5 = vector::hash((vector *)local_88);
      uVar9 = (ulong)uVar5 % *(ulong *)(this_01 + 8);
      plVar1 = *(long **)(*(long *)this_01 + uVar9 * 8);
      plVar7 = (long *)0x0;
      if ((plVar1 != (long *)0x0) &&
         (plVar7 = plVar1, plVar10 = (long *)*plVar1, uVar5 != *(uint *)((long *)*plVar1 + 1))) {
        while (plVar1 = (long *)*plVar10, plVar1 != (long *)0x0) {
          plVar7 = (long *)0x0;
          if (((ulong)*(uint *)(plVar1 + 1) % *(ulong *)(this_01 + 8) != uVar9) ||
             (plVar7 = plVar10, plVar10 = plVar1, uVar5 == *(uint *)(plVar1 + 1)))
          goto LAB_00132cf6;
        }
        plVar7 = (long *)0x0;
      }
LAB_00132cf6:
      if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
        local_8c = vector::hash((vector *)local_88);
        pmVar8 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(this_01,&local_8c);
        puVar2 = (pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar11 = (pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
            puVar11 = puVar11 + 1) {
          local_8c = *puVar11;
          v_00 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(local_38,&local_8c);
          uVar5 = vector::distance(local_50,v_00);
          if (uVar5 < uVar13) {
            pmVar12 = v_00;
            uVar13 = uVar5;
          }
        }
      }
      if (puStack_80 != (pointer)0x0) {
        operator_delete(puStack_80);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_48);
  }
  pvVar3 = local_58;
  if (pmVar12 == (mapped_type *)0x0) {
    local_78 = (_Bit_type *)0x0;
    puStack_70 = (pointer)0x0;
    local_88 = (undefined1  [8])0x0;
    puStack_80 = (pointer)0x0;
    local_68 = (_Bit_pointer)0x0;
    vector::vector(local_58,(vector<bool,_std::allocator<bool>_> *)local_88);
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
  }
  else {
    local_58->size_ = pmVar12->size_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_58->components_,&pmVar12->components_);
  }
  return pvVar3;
}

Assistant:

vector table::query(const vector& v) const {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();

    // Keep track of the best candidate we've encountered.
    const vector* best_c = nullptr;

    // Keep track of the distance to the best candidate.
    unsigned int best_d = UINT_MAX;

    for (unsigned int i = 0; i < n; i++) {
      vector k = this->masks_[i] & v;
      const partition& p = this->partitions_[i];

      auto it = p.find(k.hash());

      if (it == p.end()) {
        continue;
      }

      const bucket& b = p.at(k.hash());

      for (unsigned int u: b) {
        const vector& c = this->vectors_.at(u);

        unsigned int d = vector::distance(v, c);

        if (d < best_d) {
          best_c = &c;
          best_d = d;
        }
      }
    }

    return best_c ? *best_c : vector({});
  }